

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O2

uint64_t aom_var_2d_u8_avx2(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  __m256i vec_a;
  __m256i vec_a_00;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  undefined4 in_register_0000000c;
  ulong uVar13;
  undefined4 in_register_00000014;
  ulong uVar14;
  int iVar15;
  long lVar16;
  uint8_t *puVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  long lVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  __m256i vsrc [8];
  undefined8 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  undefined8 auStack_160 [38];
  
  uVar13 = CONCAT44(in_register_0000000c,height);
  iVar9 = width + -0x1f;
  iVar12 = height + -7;
  lVar20 = 0;
  lVar18 = 0;
  puVar17 = src;
  for (lVar16 = 0; lVar16 < iVar9; lVar16 = lVar16 + 0x20) {
    pauVar19 = (undefined1 (*) [32])(src + lVar16);
    for (iVar15 = 0; iVar15 < iVar12; iVar15 = iVar15 + 8) {
      for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 0x20) {
        uVar6 = *(undefined8 *)(*pauVar19 + 8);
        uVar7 = *(undefined8 *)(*pauVar19 + 0x10);
        uVar8 = *(undefined8 *)(*pauVar19 + 0x18);
        *(undefined8 *)((long)auStack_160 + lVar11) = *(undefined8 *)*pauVar19;
        *(undefined8 *)((long)auStack_160 + lVar11 + 8) = uVar6;
        *(undefined8 *)((long)auStack_160 + lVar11 + 0x10) = uVar7;
        *(undefined8 *)((long)auStack_160 + lVar11 + 0x18) = uVar8;
        pauVar19 = (undefined1 (*) [32])(*pauVar19 + src_stride);
      }
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 0x20) {
        auVar5 = vpunpcklbw_avx2(*(undefined1 (*) [32])((long)auStack_160 + lVar11),
                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar4 = vpunpckhbw_avx2(*(undefined1 (*) [32])((long)auStack_160 + lVar11),
                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar3 = vpaddw_avx2(auVar5,auVar21._0_32_);
        auVar3 = vpaddw_avx2(auVar3,auVar4);
        auVar21 = ZEXT3264(auVar3);
        auVar3 = vpmaddwd_avx2(auVar5,auVar5);
        auVar4 = vpmaddwd_avx2(auVar4,auVar4);
        auVar3 = vpaddd_avx2(auVar3,auVar22._0_32_);
        auVar3 = vpaddd_avx2(auVar3,auVar4);
        auVar22 = ZEXT3264(auVar3);
      }
      vec_a[1] = uVar13;
      vec_a[0] = in_stack_fffffffffffffe40;
      vec_a[2]._0_4_ = in_stack_fffffffffffffe50;
      vec_a[2]._4_4_ = iVar12;
      vec_a[3]._0_4_ = width;
      vec_a[3]._4_4_ = in_register_00000014;
      uVar10 = mm256_accumulate_epi16(vec_a);
      auVar2 = vphaddd_avx(auVar22._16_16_,auVar22._0_16_);
      auVar2 = vphaddd_avx(auVar2,auVar2);
      lVar18 = lVar18 + (ulong)uVar10;
      auVar2 = vphaddd_avx(auVar2,auVar2);
      lVar20 = lVar20 + auVar2._0_4_;
    }
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    for (; iVar15 < (int)uVar13; iVar15 = iVar15 + 1) {
      auVar5 = vpunpcklbw_avx2(*pauVar19,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar4 = vpunpckhbw_avx2(*pauVar19,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar3 = vpaddw_avx2(auVar5,auVar21._0_32_);
      auVar3 = vpaddw_avx2(auVar3,auVar4);
      auVar21 = ZEXT3264(auVar3);
      auVar3 = vpmaddwd_avx2(auVar5,auVar5);
      auVar4 = vpmaddwd_avx2(auVar4,auVar4);
      auVar3 = vpaddd_avx2(auVar3,auVar22._0_32_);
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      auVar22 = ZEXT3264(auVar3);
      pauVar19 = (undefined1 (*) [32])(*pauVar19 + src_stride);
    }
    vec_a_00[1] = uVar13;
    vec_a_00[0] = in_stack_fffffffffffffe40;
    vec_a_00[2]._0_4_ = in_stack_fffffffffffffe50;
    vec_a_00[2]._4_4_ = iVar12;
    vec_a_00[3]._0_4_ = width;
    vec_a_00[3]._4_4_ = in_register_00000014;
    uVar10 = mm256_accumulate_epi16(vec_a_00);
    auVar2 = vphaddd_avx(auVar22._16_16_,auVar22._0_16_);
    lVar18 = lVar18 + (ulong)uVar10;
    auVar2 = vphaddd_avx(auVar2,auVar2);
    auVar2 = vphaddd_avx(auVar2,auVar2);
    lVar20 = lVar20 + auVar2._0_4_;
    puVar17 = puVar17 + 0x20;
  }
  uVar14 = 0;
  iVar9 = 0;
  if (0 < (int)uVar13) {
    uVar14 = uVar13 & 0xffffffff;
    iVar9 = 0;
  }
  for (; iVar9 != (int)uVar14; iVar9 = iVar9 + 1) {
    for (lVar11 = 0; lVar16 + lVar11 < (long)width; lVar11 = lVar11 + 1) {
      bVar1 = puVar17[lVar11];
      lVar18 = lVar18 + (ulong)bVar1;
      lVar20 = lVar20 + (ulong)((uint)bVar1 * (uint)bVar1);
    }
    puVar17 = puVar17 + src_stride;
  }
  return lVar20 - (ulong)(lVar18 * lVar18) / (ulong)(long)((int)uVar13 * width);
}

Assistant:

uint64_t aom_var_2d_u8_avx2(uint8_t *src, int src_stride, int width,
                            int height) {
  uint8_t *srcp;
  uint64_t s = 0, ss = 0;
  __m256i vzero = _mm256_setzero_si256();
  __m256i v_acc_sum = vzero;
  __m256i v_acc_sqs = vzero;
  int i, j;

  // Process 32 elements in a row
  for (i = 0; i < width - 31; i += 32) {
    srcp = src + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 7; j += 8) {
      __m256i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm256_loadu_si256((__m256i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m256i vsrc0 = _mm256_unpacklo_epi8(vsrc[k], vzero);
        __m256i vsrc1 = _mm256_unpackhi_epi8(vsrc[k], vzero);
        v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc0);
        v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc1);

        __m256i vsqs0 = _mm256_madd_epi16(vsrc0, vsrc0);
        __m256i vsqs1 = _mm256_madd_epi16(vsrc1, vsrc1);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs1);
      }

      // Update total sum and clear the vectors
      s += mm256_accumulate_epi16(v_acc_sum);
      ss += mm256_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m256i vsrc = _mm256_loadu_si256((__m256i *)srcp);
      __m256i vsrc0 = _mm256_unpacklo_epi8(vsrc, vzero);
      __m256i vsrc1 = _mm256_unpackhi_epi8(vsrc, vzero);
      v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc0);
      v_acc_sum = _mm256_add_epi16(v_acc_sum, vsrc1);

      __m256i vsqs0 = _mm256_madd_epi16(vsrc0, vsrc0);
      __m256i vsqs1 = _mm256_madd_epi16(vsrc1, vsrc1);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs1);

      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm256_accumulate_epi16(v_acc_sum);
    ss += mm256_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = src;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint8_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}